

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall
VulkanHppGenerator::checkStructMemberCorrectness
          (VulkanHppGenerator *this,string *structureName,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *members,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *sTypeValues)

{
  string *psVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  pointer pbVar4;
  size_type sVar5;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *pvVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  void *pvVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arraySize;
  pointer __k;
  int __c;
  _Base_ptr p_Var18;
  VulkanHppGenerator *pVVar19;
  _Base_ptr p_Var20;
  size_type sVar21;
  pointer pMVar22;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar23;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [39];
  char local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  undefined1 local_120 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  pointer local_e0;
  undefined1 local_d8 [32];
  string *local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  VulkanHppGenerator *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  VulkanHppGenerator *local_68;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *local_60;
  pointer local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
  *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_b8 = structureName;
  local_78 = (_Base_ptr)sTypeValues;
  local_181 = isTypeUsed(this,structureName);
  pMVar22 = (members->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (members->
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar22 != local_58) {
    local_a8 = (_Base_ptr)&this->m_types;
    local_b0 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88 = (VulkanHppGenerator *)&this->m_enums;
    local_90 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = (VulkanHppGenerator *)&this->m_structs;
    local_70 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50 = &this->m_constants;
    local_48 = &(this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = members;
    do {
      psVar1 = &(pMVar22->type).type;
      local_1c8._8_8_ = (pMVar22->type).type._M_dataplus._M_p;
      local_1c8._0_8_ = (pMVar22->type).type._M_string_length;
      pVVar19 = (VulkanHppGenerator *)local_1c8;
      bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,"Vk");
      local_a0 = (_Base_ptr)psVar1;
      if (bVar7) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                        *)local_a8,psVar1);
        if (cVar9._M_node == local_b0) {
          __assert_fail("memberTypeIt != m_types.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4ea,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        p_Var18 = cVar9._M_node[3]._M_left;
        iVar8 = pMVar22->xmlLine;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,"struct member type <",psVar1);
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,"> used in struct <");
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar10->_M_dataplus)._M_p;
        paVar16 = &pbVar10->field_2;
        if (paVar17 == paVar16) {
          local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_180._M_dataplus._M_p = (pointer)paVar17;
        }
        local_180._M_string_length = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_180,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
        local_1a8._0_8_ = local_1a8 + 0x10;
        p_Var20 = (_Base_ptr)(pbVar10->_M_dataplus)._M_p;
        paVar17 = &pbVar10->field_2;
        if (p_Var20 == (_Base_ptr)paVar17) {
          local_1a8._16_8_ = paVar17->_M_allocated_capacity;
          local_1a8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_1a8._16_8_ = paVar17->_M_allocated_capacity;
          local_1a8._0_8_ = p_Var20;
        }
        local_1a8._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"> is never required for any feature or extension");
        local_1c8._0_8_ = local_1c8 + 0x10;
        pcVar2 = (pbVar10->_M_dataplus)._M_p;
        paVar17 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar17) {
          local_1c8._16_8_ = paVar17->_M_allocated_capacity;
          local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_1c8._16_8_ = paVar17->_M_allocated_capacity;
          local_1c8._0_8_ = pcVar2;
        }
        local_1c8._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        checkForError(p_Var18 != (_Base_ptr)0x0,iVar8,(string *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        pVVar19 = (VulkanHppGenerator *)local_160._0_8_;
        if ((VulkanHppGenerator *)local_160._0_8_ != (VulkanHppGenerator *)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
        }
      }
      pvVar6 = local_60;
      local_e0 = pMVar22;
      if ((pMVar22->selector)._M_string_length != 0) {
        cVar11 = findStructMemberIt(pVVar19,&pMVar22->selector,local_60);
        if (cVar11._M_current ==
            (pvVar6->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("selectorIt != members.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f5,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        local_80 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                           *)local_88,&((cVar11._M_current)->type).type);
        if (local_80 == local_90) {
          __assert_fail("selectorEnumIt != m_enums.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f7,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        pVVar19 = local_68;
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                         *)local_68,(key_type *)local_a0);
        if ((cVar12._M_node == local_70) ||
           (*(char *)((long)&cVar12._M_node[3]._M_left + 2) == '\0')) {
          __assert_fail("( unionIt != m_structs.end() ) && unionIt->second.isUnion",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f9,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        p_Var18 = cVar12._M_node[3]._M_right;
        local_40 = *(_Base_ptr *)(cVar12._M_node + 4);
        if (p_Var18 != local_40) {
          local_80 = (_Base_ptr)&local_80[5]._M_left;
          do {
            p_Var20 = p_Var18[9]._M_right;
            local_38 = *(_Base_ptr *)(p_Var18 + 10);
            if (p_Var20 == local_38) {
              __assert_fail("!unionMember.selection.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x4fd,
                            "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                           );
            }
            local_98 = p_Var18 + 4;
            do {
              bVar7 = contains(pVVar19,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                        *)local_80,(string *)p_Var20);
              iVar8 = *(int *)&p_Var18[0xc]._M_left;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,"union member <",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_120,"> uses selection <");
              local_140._M_allocated_capacity = (size_type)&local_130;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar10->_M_dataplus)._M_p;
              paVar16 = &pbVar10->field_2;
              if (paVar17 == paVar16) {
                local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_130._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              }
              else {
                local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_140._M_allocated_capacity = (size_type)paVar17;
              }
              local_140._8_8_ = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_140,*(char **)p_Var20,(size_type)p_Var20->_M_parent);
              local_160._0_8_ = local_160 + 0x10;
              pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
              paVar17 = &pbVar10->field_2;
              if (pVVar19 == (VulkanHppGenerator *)paVar17) {
                local_160._16_8_ = paVar17->_M_allocated_capacity;
                local_160._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              }
              else {
                local_160._16_8_ = paVar17->_M_allocated_capacity;
                local_160._0_8_ = pVVar19;
              }
              local_160._8_8_ = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_160,"> that is not part of the selector type <");
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar10->_M_dataplus)._M_p;
              paVar16 = &pbVar10->field_2;
              if (paVar17 == paVar16) {
                local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              }
              else {
                local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_180._M_dataplus._M_p = (pointer)paVar17;
              }
              local_180._M_string_length = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_180,((cVar11._M_current)->type).type._M_dataplus._M_p,
                                   ((cVar11._M_current)->type).type._M_string_length);
              local_1a8._0_8_ = local_1a8 + 0x10;
              p_Var3 = (_Base_ptr)(pbVar10->_M_dataplus)._M_p;
              paVar17 = &pbVar10->field_2;
              if (p_Var3 == (_Base_ptr)paVar17) {
                local_1a8._16_8_ = paVar17->_M_allocated_capacity;
                local_1a8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              }
              else {
                local_1a8._16_8_ = paVar17->_M_allocated_capacity;
                local_1a8._0_8_ = p_Var3;
              }
              local_1a8._8_8_ = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8,">");
              local_1c8._0_8_ = local_1c8 + 0x10;
              pcVar2 = (pbVar10->_M_dataplus)._M_p;
              paVar17 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 == paVar17) {
                local_1c8._16_8_ = paVar17->_M_allocated_capacity;
                local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              }
              else {
                local_1c8._16_8_ = paVar17->_M_allocated_capacity;
                local_1c8._0_8_ = pcVar2;
              }
              local_1c8._8_8_ = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              checkForError(bVar7,iVar8,(string *)local_1c8);
              if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
              }
              if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((VulkanHppGenerator *)local_160._0_8_ != (VulkanHppGenerator *)(local_160 + 0x10))
              {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_allocated_capacity != &local_130) {
                operator_delete((void *)local_140._M_allocated_capacity,
                                (ulong)(local_130._M_allocated_capacity + 1));
              }
              pVVar19 = (VulkanHppGenerator *)local_120._0_8_;
              if ((VulkanHppGenerator *)local_120._0_8_ != (VulkanHppGenerator *)(local_120 + 0x10))
              {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
              }
              p_Var20 = p_Var20 + 1;
            } while (p_Var20 != local_38);
            p_Var18 = (_Base_ptr)&p_Var18[0xc]._M_right;
          } while (p_Var18 != local_40);
        }
      }
      p_Var18 = local_a0;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                      *)local_a8,(key_type *)local_a0);
      pMVar22 = local_e0;
      iVar8 = local_e0->xmlLine;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "struct member uses unknown type <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var18);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,">");
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar17 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar17) {
        local_1c8._16_8_ = paVar17->_M_allocated_capacity;
        local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_1c8._16_8_ = paVar17->_M_allocated_capacity;
        local_1c8._0_8_ = pcVar2;
      }
      local_1c8._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      checkForError(cVar9._M_node != local_b0,iVar8,(string *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      __k = (pMVar22->arraySizes).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (pMVar22->arraySizes).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_00138dda:
      p_Var18 = local_a0;
      pMVar22 = local_e0;
      if (__k != pbVar4) {
        sVar5 = __k->_M_string_length;
        if (sVar5 != 0) {
          pcVar2 = (__k->_M_dataplus)._M_p;
          sVar21 = 0;
          do {
            pvVar13 = memchr("0123456789",(int)pcVar2[sVar21],10);
            if (pvVar13 == (void *)0x0) {
              if ((sVar21 != 0xffffffffffffffff) &&
                 (cVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                           ::find(&local_50->_M_t,__k), cVar14._M_node == local_48)) {
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                *)local_a8,__k);
                if (cVar9._M_node == local_b0) goto LAB_00138ea2;
                sVar5 = __k->_M_string_length;
                local_98 = (_Base_ptr)cVar9;
                if (sVar5 == 0) goto LAB_00138e90;
                pcVar2 = (__k->_M_dataplus)._M_p;
                sVar21 = 0;
                goto LAB_00138e77;
              }
              break;
            }
            sVar21 = sVar21 + 1;
          } while (sVar5 != sVar21);
        }
        goto LAB_00138f62;
      }
      if ((local_e0->value)._M_string_length != 0) {
        psVar1 = &local_e0->value;
        pVVar19 = local_88;
        cVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                         *)local_88,(key_type *)local_a0);
        if (cVar15._M_node == local_90) {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          p_Var18,"uint32_t");
          if (iVar8 == 0) {
            sVar5 = (pMVar22->value)._M_string_length;
            if (sVar5 == 0) {
              bVar7 = true;
            }
            else {
              pcVar2 = (psVar1->_M_dataplus)._M_p;
              sVar21 = 0;
              do {
                pvVar13 = memchr("0123456789",(int)pcVar2[sVar21],10);
                if (pvVar13 == (void *)0x0) goto LAB_001390f9;
                sVar21 = sVar21 + 1;
              } while (sVar5 != sVar21);
              sVar21 = 0xffffffffffffffff;
LAB_001390f9:
              bVar7 = sVar21 == 0xffffffffffffffff;
              pMVar22 = local_e0;
            }
            iVar8 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,"value <",psVar1);
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,"> for member <");
            local_100._M_allocated_capacity = (size_type)&local_f0;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_f0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_100._M_allocated_capacity = (size_type)paVar17;
            }
            local_100._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_100,(pMVar22->name)._M_dataplus._M_p,
                                 (pMVar22->name)._M_string_length);
            local_120._0_8_ = local_120 + 0x10;
            pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (pVVar19 == (VulkanHppGenerator *)paVar17) {
              local_120._16_8_ = paVar17->_M_allocated_capacity;
              local_120._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_120._16_8_ = paVar17->_M_allocated_capacity;
              local_120._0_8_ = pVVar19;
            }
            local_120._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_120,"> in structure <");
            local_140._M_allocated_capacity = (size_type)&local_130;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_130._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_140._M_allocated_capacity = (size_type)paVar17;
            }
            local_140._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_140,(local_b8->_M_dataplus)._M_p,
                                 local_b8->_M_string_length);
            local_160._0_8_ = local_160 + 0x10;
            pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (pVVar19 == (VulkanHppGenerator *)paVar17) {
              local_160._16_8_ = paVar17->_M_allocated_capacity;
              local_160._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_160._16_8_ = paVar17->_M_allocated_capacity;
              local_160._0_8_ = pVVar19;
            }
            local_160._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_160,"> of type <");
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_180._M_dataplus._M_p = (pointer)paVar17;
            }
            local_180._M_string_length = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_180,(pMVar22->type).type._M_dataplus._M_p,
                                 (pMVar22->type).type._M_string_length);
            local_1a8._0_8_ = local_1a8 + 0x10;
            p_Var18 = (_Base_ptr)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (p_Var18 == (_Base_ptr)paVar17) {
              local_1a8._16_8_ = paVar17->_M_allocated_capacity;
              local_1a8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1a8._16_8_ = paVar17->_M_allocated_capacity;
              local_1a8._0_8_ = p_Var18;
            }
            local_1a8._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,"> is not a number");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar17) {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            checkForError(bVar7,iVar8,(string *)local_1c8);
          }
          else {
            iVar8 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,"member <",&pMVar22->name);
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,"> in structure <");
            local_100._M_allocated_capacity = (size_type)&local_f0;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_f0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_100._M_allocated_capacity = (size_type)paVar17;
            }
            local_100._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_100,(local_b8->_M_dataplus)._M_p,
                                 local_b8->_M_string_length);
            local_120._0_8_ = local_120 + 0x10;
            pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (pVVar19 == (VulkanHppGenerator *)paVar17) {
              local_120._16_8_ = paVar17->_M_allocated_capacity;
              local_120._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_120._16_8_ = paVar17->_M_allocated_capacity;
              local_120._0_8_ = pVVar19;
            }
            local_120._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_120,"> holds value <");
            local_140._M_allocated_capacity = (size_type)&local_130;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_130._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_140._M_allocated_capacity = (size_type)paVar17;
            }
            local_140._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_140,(pMVar22->value)._M_dataplus._M_p,
                                 (pMVar22->value)._M_string_length);
            local_160._0_8_ = local_160 + 0x10;
            pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (pVVar19 == (VulkanHppGenerator *)paVar17) {
              local_160._16_8_ = paVar17->_M_allocated_capacity;
              local_160._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_160._16_8_ = paVar17->_M_allocated_capacity;
              local_160._0_8_ = pVVar19;
            }
            local_160._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_160,"> for an unhandled type <");
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar16 = &pbVar10->field_2;
            if (paVar17 == paVar16) {
              local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_180._M_dataplus._M_p = (pointer)paVar17;
            }
            local_180._M_string_length = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_180,(pMVar22->type).type._M_dataplus._M_p,
                                 (pMVar22->type).type._M_string_length);
            local_1a8._0_8_ = local_1a8 + 0x10;
            p_Var18 = (_Base_ptr)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (p_Var18 == (_Base_ptr)paVar17) {
              local_1a8._16_8_ = paVar17->_M_allocated_capacity;
              local_1a8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1a8._16_8_ = paVar17->_M_allocated_capacity;
              local_1a8._0_8_ = p_Var18;
            }
            local_1a8._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,">");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar17) {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            checkForError(false,iVar8,(string *)local_1c8);
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((VulkanHppGenerator *)local_160._0_8_ != (VulkanHppGenerator *)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_allocated_capacity != &local_130) {
            operator_delete((void *)local_140._M_allocated_capacity,
                            (ulong)(local_130._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_120._0_8_ != (VulkanHppGenerator *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_allocated_capacity != &local_f0) {
            operator_delete((void *)local_100._M_allocated_capacity,
                            local_f0._M_allocated_capacity + 1);
          }
          p_Var18 = (_Base_ptr)local_d8._16_8_;
          p_Var20 = (_Base_ptr)local_d8._0_8_;
          if ((_Base_ptr)local_d8._0_8_ != (_Base_ptr)(local_d8 + 0x10)) {
LAB_00139ba7:
            operator_delete(p_Var20,(ulong)((long)&p_Var18->_M_color + 1));
          }
        }
        else if (local_181 != '\0') {
          bVar7 = contains(pVVar19,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                    *)&cVar15._M_node[5]._M_left,psVar1);
          iVar8 = pMVar22->xmlLine;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"value <",psVar1);
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,"> for member <");
          local_100._M_allocated_capacity = (size_type)&local_f0;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar10->_M_dataplus)._M_p;
          paVar16 = &pbVar10->field_2;
          if (paVar17 == paVar16) {
            local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_f0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_f0._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_100._M_allocated_capacity = (size_type)paVar17;
          }
          local_100._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_100,(pMVar22->name)._M_dataplus._M_p,
                                (pMVar22->name)._M_string_length);
          local_120._0_8_ = local_120 + 0x10;
          pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
          paVar17 = &pbVar10->field_2;
          if (pVVar19 == (VulkanHppGenerator *)paVar17) {
            local_120._16_8_ = paVar17->_M_allocated_capacity;
            local_120._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_120._16_8_ = paVar17->_M_allocated_capacity;
            local_120._0_8_ = pVVar19;
          }
          local_120._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,"> in structure <");
          local_140._M_allocated_capacity = (size_type)&local_130;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar10->_M_dataplus)._M_p;
          paVar16 = &pbVar10->field_2;
          if (paVar17 == paVar16) {
            local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_130._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_140._M_allocated_capacity = (size_type)paVar17;
          }
          local_140._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_140,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length)
          ;
          local_160._0_8_ = local_160 + 0x10;
          pVVar19 = (VulkanHppGenerator *)(pbVar10->_M_dataplus)._M_p;
          paVar17 = &pbVar10->field_2;
          if (pVVar19 == (VulkanHppGenerator *)paVar17) {
            local_160._16_8_ = paVar17->_M_allocated_capacity;
            local_160._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_160._16_8_ = paVar17->_M_allocated_capacity;
            local_160._0_8_ = pVVar19;
          }
          local_160._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160,"> of enum type <");
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar10->_M_dataplus)._M_p;
          paVar16 = &pbVar10->field_2;
          if (paVar17 == paVar16) {
            local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_180.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_180._M_dataplus._M_p = (pointer)paVar17;
          }
          local_180._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_180,(pMVar22->type).type._M_dataplus._M_p,
                                (pMVar22->type).type._M_string_length);
          local_1a8._0_8_ = local_1a8 + 0x10;
          p_Var18 = (_Base_ptr)(pbVar10->_M_dataplus)._M_p;
          paVar17 = &pbVar10->field_2;
          if (p_Var18 == (_Base_ptr)paVar17) {
            local_1a8._16_8_ = paVar17->_M_allocated_capacity;
            local_1a8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_1a8._16_8_ = paVar17->_M_allocated_capacity;
            local_1a8._0_8_ = p_Var18;
          }
          local_1a8._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8,"> not listed");
          local_1c8._0_8_ = local_1c8 + 0x10;
          pcVar2 = (pbVar10->_M_dataplus)._M_p;
          paVar17 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 == paVar17) {
            local_1c8._16_8_ = paVar17->_M_allocated_capacity;
            local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_1c8._16_8_ = paVar17->_M_allocated_capacity;
            local_1c8._0_8_ = pcVar2;
          }
          local_1c8._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          checkForError(bVar7,iVar8,(string *)local_1c8);
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((VulkanHppGenerator *)local_160._0_8_ != (VulkanHppGenerator *)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_allocated_capacity != &local_130) {
            operator_delete((void *)local_140._M_allocated_capacity,
                            (ulong)(local_130._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_120._0_8_ != (VulkanHppGenerator *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_allocated_capacity != &local_f0) {
            operator_delete((void *)local_100._M_allocated_capacity,
                            local_f0._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)local_d8._0_8_ != (_Base_ptr)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&pMVar22->name,"sType");
          if (iVar8 == 0) {
            pVar23 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_78,psVar1);
            iVar8 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"sType value <",psVar1);
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,"> has been used before");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar17) {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar17->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            checkForError((bool)(pVar23.second & 1),iVar8,(string *)local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            p_Var18 = (_Base_ptr)local_1a8._16_8_;
            p_Var20 = (_Base_ptr)local_1a8._0_8_;
            if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) goto LAB_00139ba7;
          }
        }
      }
      pMVar22 = pMVar22 + 1;
    } while (pMVar22 != local_58);
  }
  return;
  while (sVar21 = sVar21 + 1, sVar5 != sVar21) {
LAB_00138e77:
    __c = (int)pcVar2[sVar21];
    iVar8 = toupper(__c);
    if (iVar8 != __c) goto LAB_00138ea2;
  }
LAB_00138e90:
  bVar7 = local_98[2]._M_color == 5;
LAB_00138ea5:
  iVar8 = local_e0->xmlLine;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "struct member array size uses unknown constant <",__k);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,">");
  local_1c8._0_8_ = local_1c8 + 0x10;
  pcVar2 = (pbVar10->_M_dataplus)._M_p;
  paVar17 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar17) {
    local_1c8._16_8_ = paVar17->_M_allocated_capacity;
    local_1c8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_1c8._16_8_ = paVar17->_M_allocated_capacity;
    local_1c8._0_8_ = pcVar2;
  }
  local_1c8._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  checkForError(bVar7,iVar8,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
LAB_00138f62:
  __k = __k + 1;
  goto LAB_00138dda;
LAB_00138ea2:
  bVar7 = false;
  goto LAB_00138ea5;
}

Assistant:

void VulkanHppGenerator::checkStructMemberCorrectness( std::string const &             structureName,
                                                       std::vector<MemberData> const & members,
                                                       std::set<std::string> &         sTypeValues ) const
{
  // determine if this struct is requird/used
  const bool structUsed = isTypeUsed( structureName );

  for ( auto const & member : members )
  {
    // check that all member types are required in some feature or extension
    if ( member.type.type.starts_with( "Vk" ) )
    {
      auto memberTypeIt = m_types.find( member.type.type );
      assert( memberTypeIt != m_types.end() );
      checkForError( !memberTypeIt->second.requiredBy.empty(),
                     member.xmlLine,
                     "struct member type <" + member.type.type + "> used in struct <" + structureName + "> is never required for any feature or extension" );
    }

    // if a member specifies a selector, that member is a union and the selector is an enum
    // check that there's a 1-1 connection between the specified selections and the values of that enum
    if ( !member.selector.empty() )
    {
      auto selectorIt = findStructMemberIt( member.selector, members );
      assert( selectorIt != members.end() );
      auto selectorEnumIt = m_enums.find( selectorIt->type.type );
      assert( selectorEnumIt != m_enums.end() );
      auto unionIt = m_structs.find( member.type.type );
      assert( ( unionIt != m_structs.end() ) && unionIt->second.isUnion );
      for ( auto const & unionMember : unionIt->second.members )
      {
        // check that each union member has a selection, that is a value of the seleting enum
        assert( !unionMember.selection.empty() );
        for ( auto const & selection : unionMember.selection )
        {
          checkForError( contains( selectorEnumIt->second.values, selection ),
                         unionMember.xmlLine,
                         "union member <" + unionMember.name + "> uses selection <" + selection + "> that is not part of the selector type <" +
                           selectorIt->type.type + ">" );
        }
      }
    }

    // check that each member type is known
    checkForError( m_types.contains( member.type.type ), member.xmlLine, "struct member uses unknown type <" + member.type.type + ">" );

    // check that any used constant is a known constant or some potentially externally defined constant
    for ( auto const & arraySize : member.arraySizes )
    {
      if ( !isNumber( arraySize ) && !m_constants.contains( arraySize ) )
      {
        auto typeIt = m_types.find( arraySize );
        checkForError( ( typeIt != m_types.end() ) && isAllUpper( arraySize ) && ( typeIt->second.category == TypeCategory::ExternalType ),
                       member.xmlLine,
                       "struct member array size uses unknown constant <" + arraySize + ">" );
      }
    }

    // checks if a value is specified
    if ( !member.value.empty() )
    {
      auto enumIt = m_enums.find( member.type.type );
      if ( enumIt != m_enums.end() )
      {
        // check that the value exists in the specified enum (if the struct is used at all)
        if ( structUsed )
        {
          checkForError( contains( enumIt->second.values, member.value ),
                         member.xmlLine,
                         "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of enum type <" +
                           member.type.type + "> not listed" );
          // special handling for sType: no value should appear more than once
          if ( member.name == "sType" )
          {
            checkForError( sTypeValues.insert( member.value ).second, member.xmlLine, "sType value <" + member.value + "> has been used before" );
          }
        }
      }
      else if ( member.type.type == "uint32_t" )
      {
        checkForError( isNumber( member.value ),
                       member.xmlLine,
                       "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of type <" + member.type.type +
                         "> is not a number" );
      }
      else
      {
        // don't know the type of the value -> error out
        checkForError( false,
                       member.xmlLine,
                       "member <" + member.name + "> in structure <" + structureName + "> holds value <" + member.value + "> for an unhandled type <" +
                         member.type.type + ">" );
      }
    }
  }
}